

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiListClipperData::Reset(ImGuiListClipperData *this,ImGuiListClipper *clipper)

{
  ImVector<ImGuiListClipperRange> *in_RSI;
  undefined8 *in_RDI;
  int in_stack_ffffffffffffffec;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  ImVector<ImGuiListClipperRange>::resize(in_RSI,in_stack_ffffffffffffffec);
  return;
}

Assistant:

void                            Reset(ImGuiListClipper* clipper) { ListClipper = clipper; StepNo = ItemsFrozen = 0; Ranges.resize(0); }